

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

int glu::TextureTestUtil::computeTextureCompareDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,Texture2DArrayView *src,float *texCoord,
              ReferenceParams *sampleParams,TexComparePrecision *comparePrec,LodPrecision *lodPrec,
              Vec3 *nonShadowThreshold)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  ReferenceParams *pRVar4;
  bool bVar5;
  int i;
  long lVar6;
  int iVar7;
  ConstPixelBufferAccess *pCVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  uint uVar38;
  float fVar39;
  uint uVar41;
  float fVar42;
  undefined1 auVar40 [16];
  Vector<float,_3> res_1;
  Vec2 lodO;
  Vec2 lodBounds;
  Vec3 triR [2];
  Vec3 triT [2];
  Vec4 resPix;
  Vec3 triS [2];
  Vec2 clampedLod;
  Vec4 refPix;
  int local_2dc;
  Vec2 local_2d8;
  float local_2d0;
  float local_2cc;
  ulong local_2c8;
  ConstPixelBufferAccess *local_2c0;
  Vec3 local_2b8;
  float local_2a8;
  float local_2a4;
  ReferenceParams *local_2a0;
  undefined8 local_298;
  undefined4 local_290;
  ulong local_288;
  int local_280;
  float local_27c;
  float local_278;
  float fStack_274;
  undefined8 uStack_270;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258 [8];
  float local_238 [6];
  PixelBufferAccess *local_220;
  undefined1 local_218 [36];
  float local_1f4;
  tcu local_1e8 [8];
  float local_1e0;
  undefined1 local_1d8 [8];
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  Sampler *local_130;
  Texture2DArrayView *local_128;
  ConstPixelBufferAccess *local_120;
  float local_118;
  float fStack_114;
  float afStack_110 [2];
  undefined8 local_108;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58 [10];
  undefined1 auVar27 [16];
  
  local_218._16_4_ = *texCoord;
  local_238[0] = texCoord[1];
  local_218._20_4_ = texCoord[3];
  local_218._24_4_ = texCoord[6];
  local_218._28_4_ = texCoord[9];
  local_238[1] = texCoord[4];
  local_238[2] = texCoord[7];
  local_238[3] = texCoord[10];
  local_258[0] = texCoord[2];
  local_258[1] = texCoord[5];
  local_258[2] = texCoord[8];
  local_258[3] = texCoord[0xb];
  if (src->m_numLevels < 1) {
    local_278 = 0.0;
    fStack_274 = 0.0;
  }
  else {
    uVar1 = *(undefined8 *)(src->m_levels->m_size).m_data;
    local_278 = (float)(int)uVar1;
    fStack_274 = (float)(int)((ulong)uVar1 >> 0x20);
  }
  uStack_270 = 0;
  local_2cc = (float)(result->m_size).m_data[0];
  fVar33 = (float)(result->m_size).m_data[1];
  local_118 = (sampleParams->super_RenderParams).w.m_data[0];
  fStack_114 = (sampleParams->super_RenderParams).w.m_data[1];
  afStack_110[0] = (sampleParams->super_RenderParams).w.m_data[2];
  afStack_110[1] = (sampleParams->super_RenderParams).w.m_data[3];
  local_108 = CONCAT44(fStack_114,afStack_110[0]);
  _local_1d8 = ZEXT816(0);
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    _local_1d8 = ZEXT416((uint)(sampleParams->super_RenderParams).bias);
  }
  local_58[0] = -1.0;
  local_58[1] = 0.0;
  local_58[2] = 1.0;
  local_58[3] = 0.0;
  local_58[4] = 0.0;
  local_58[5] = -1.0;
  local_58[6] = 0.0;
  local_58[7] = 1.0;
  local_1c8._0_4_ = -1.7146522e+38;
  local_2c0 = result;
  local_2a0 = sampleParams;
  local_258[4] = local_258[2];
  local_258[5] = local_258[1];
  local_238[4] = local_238[2];
  local_238[5] = local_238[1];
  local_218._32_4_ = local_218._24_4_;
  local_1f4 = (float)local_218._20_4_;
  local_120 = reference;
  tcu::RGBA::toVec((RGBA *)local_1c8);
  tcu::clear(errorMask,(Vec4 *)local_218);
  iVar9 = (local_2c0->m_size).m_data[1];
  if (iVar9 < 1) {
    local_2c8 = 0;
  }
  else {
    local_130 = &local_2a0->sampler;
    iVar7 = (local_2c0->m_size).m_data[0];
    local_1d8._4_4_ = local_1d8._0_4_;
    uStack_1d0 = local_1d8._0_4_;
    uStack_1cc = local_1d8._0_4_;
    local_e8._4_4_ = fStack_274;
    local_e8._0_4_ = fStack_274;
    local_e8._8_4_ = fStack_274;
    local_e8._12_4_ = fStack_274;
    local_2c8 = 0;
    local_2dc = 0;
    pCVar8 = local_2c0;
    local_220 = errorMask;
    local_128 = src;
    do {
      if (0 < iVar7) {
        local_2d0 = (float)local_2dc + 0.5;
        local_f8 = ZEXT416((uint)(local_2d0 / fVar33));
        local_27c = fVar33 - local_2d0;
        local_d8 = ZEXT416((uint)(1.0 - local_2d0 / fVar33));
        iVar9 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_218,(int)pCVar8,iVar9,local_2dc);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_1c8,(int)local_120,iVar9,local_2dc);
          local_288 = local_1c8._4_8_;
          local_280 = local_1c8._12_4_;
          local_1e8[0] = (tcu)local_218[4];
          local_1e8[1] = (tcu)local_218[5];
          local_1e8[2] = (tcu)local_218[6];
          local_1e8[3] = (tcu)local_218[7];
          local_1e8[4] = (tcu)local_218[8];
          local_1e8[5] = (tcu)local_218[9];
          local_1e8[6] = (tcu)local_218[10];
          local_1e8[7] = (tcu)local_218[0xb];
          local_1e0 = (float)local_218._12_4_;
          local_2b8.m_data[0] = 0.0;
          local_2b8.m_data[1] = 0.0;
          local_2b8.m_data[2] = 0.0;
          lVar6 = 0;
          do {
            local_2b8.m_data[lVar6] =
                 *(float *)((long)&local_288 + lVar6 * 4) - *(float *)(local_1e8 + lVar6 * 4);
            lVar6 = lVar6 + 1;
          } while (lVar6 != 3);
          local_290 = 0;
          local_298 = 0;
          lVar6 = 0;
          do {
            fVar10 = local_2b8.m_data[lVar6];
            auVar23._0_4_ = -fVar10;
            auVar23._4_4_ = 0x80000000;
            auVar23._8_4_ = 0x80000000;
            auVar23._12_4_ = 0x80000000;
            if (auVar23._0_4_ <= fVar10) {
              auVar23._0_4_ = fVar10;
            }
            *(int *)((long)&local_298 + lVar6 * 4) = auVar23._0_4_;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 3);
          local_2d8.m_data = local_2d8.m_data & 0xffffffffff000000;
          lVar6 = 0;
          do {
            *(bool *)((long)local_2d8.m_data + lVar6) =
                 *(float *)((long)&local_298 + lVar6 * 4) <= nonShadowThreshold->m_data[lVar6];
            lVar6 = lVar6 + 1;
          } while (lVar6 != 3);
          if (((local_2d8.m_data[0]._0_1_ == '\0') || (local_2d8.m_data[0]._1_1_ == '\0')) ||
             (local_2d8.m_data[0]._2_1_ == '\0')) {
            local_2b8.m_data[0] = -1.7014636e+38;
            tcu::RGBA::toVec((RGBA *)&local_2b8);
            tcu::PixelBufferAccess::setPixel(local_220,(Vec4 *)&local_298,iVar9,local_2dc,0);
            local_2c8 = (ulong)((int)local_2c8 + 1);
          }
          else if (((float)local_218._0_4_ != (float)local_1c8._0_4_) ||
                  (NAN((float)local_218._0_4_) || NAN((float)local_1c8._0_4_))) {
            fVar10 = (float)iVar9 + 0.5;
            fVar19 = fVar10 / local_2cc;
            bVar5 = 1.0 <= (float)local_f8._0_4_ + fVar19;
            if (bVar5) {
              local_2a4 = local_2cc - fVar10;
              local_2a8 = local_27c;
            }
            else {
              local_2a8 = local_2d0;
              local_2a4 = fVar10;
            }
            lVar6 = (ulong)((uint)bVar5 * 4) * 3;
            fVar14 = *(float *)((long)local_238 + lVar6);
            fVar17 = *(float *)((long)local_238 + lVar6 + 4);
            fVar18 = *(float *)((long)local_238 + lVar6 + 8);
            uVar2 = *(ulong *)((long)&local_118 + lVar6);
            fVar15 = (float)uVar2;
            fStack_94 = (float)(uVar2 >> 0x20);
            auVar29._8_8_ = 0;
            auVar29._0_8_ = *(ulong *)((long)afStack_110 + lVar6 + -4);
            uVar38 = (int)((uint)bVar5 << 0x1f) >> 0x1f;
            uVar41 = (int)((uint)bVar5 << 0x1f) >> 0x1f;
            auVar40._0_4_ = ~uVar38 & local_f8._0_4_;
            auVar40._4_4_ = ~uVar41 & (uint)fVar19;
            auVar40._8_4_ = local_f8._8_4_;
            auVar40._12_4_ = local_f8._12_4_;
            auVar35._4_4_ = (uint)(1.0 - fVar19) & uVar41;
            auVar35._0_4_ = local_d8._0_4_ & uVar38;
            auVar35._8_8_ = 0;
            auVar40 = auVar40 | auVar35;
            fVar39 = auVar40._0_4_;
            fVar42 = auVar40._4_4_;
            fVar16 = auVar40._8_4_;
            fVar20 = auVar40._12_4_;
            fVar28 = (1.0 - fVar42) - fVar39;
            auVar23 = divps(auVar40,auVar29);
            auVar24._4_4_ = auVar23._4_4_;
            auVar24._0_4_ = auVar24._4_4_;
            auVar24._8_4_ = auVar24._4_4_;
            auVar24._12_4_ = auVar24._4_4_;
            auVar25._4_12_ = auVar24._4_12_;
            auVar25._0_4_ = auVar24._4_4_ + fVar28 / fVar15 + auVar23._0_4_;
            fVar32 = (float)*(undefined8 *)(local_218 + lVar6 + 0x14);
            local_198._4_4_ = (undefined4)((ulong)*(undefined8 *)(local_218 + lVar6 + 0x14) >> 0x20)
            ;
            auVar12._0_4_ = fVar32 * fVar39;
            auVar12._4_4_ = fVar14 * fVar28;
            auVar12._8_4_ = fVar16 * 0.0;
            auVar12._12_4_ = fVar20 * 0.0;
            fVar19 = *(float *)(local_218 + lVar6 + 0x10);
            auVar30._0_4_ = fVar19 * fVar28;
            auVar30._4_4_ = fVar17 * fVar39;
            auVar30._8_4_ = fVar16 * 0.0;
            auVar30._12_4_ = fVar20 * 0.0;
            auVar31._8_8_ = 0;
            auVar31._0_8_ = uVar2;
            auVar31 = divps(auVar30,auVar31);
            auVar3._4_4_ = fVar15;
            auVar3._0_4_ = fStack_94;
            auVar3._8_8_ = 0;
            auVar23 = divps(auVar12,auVar3);
            auVar34._0_4_ = (float)local_198._4_4_ * fVar42;
            auVar34._4_4_ = fVar18 * fVar42;
            auVar34._8_4_ = (float)local_198._4_4_ * fVar42;
            auVar34._12_4_ = (float)local_198._4_4_ * fVar42;
            fVar11 = *(float *)((long)afStack_110 + lVar6);
            auVar13._4_4_ = fVar11;
            auVar13._0_4_ = fVar11;
            auVar13._8_8_ = 0;
            auVar35 = divps(auVar34,auVar13);
            auVar36._0_4_ = auVar35._0_4_ + auVar31._0_4_ + auVar23._0_4_;
            auVar36._4_4_ = auVar35._4_4_ + auVar31._4_4_ + auVar23._4_4_;
            auVar36._8_4_ = auVar35._8_4_ + auVar31._8_4_ + auVar23._8_4_;
            auVar36._12_4_ = auVar35._12_4_ + auVar31._12_4_ + auVar23._12_4_;
            local_2b8.m_data[2] =
                 ((*(float *)((long)local_258 + lVar6 + 4) * fVar39) / fStack_94 +
                  (*(float *)((long)local_258 + lVar6) * fVar28) / fVar15 +
                 (*(float *)((long)local_258 + lVar6 + 8) * fVar42) / fVar11) / auVar25._0_4_;
            auVar27._0_8_ = auVar25._0_8_;
            auVar27._8_4_ = auVar24._4_4_;
            auVar27._12_4_ = auVar24._4_4_;
            auVar26._8_8_ = auVar27._8_8_;
            auVar26._4_4_ = auVar25._0_4_;
            auVar26._0_4_ = auVar25._0_4_;
            auVar23 = divps(auVar36,auVar26);
            local_2b8.m_data._0_8_ = auVar23._0_8_;
            fVar37 = fVar39 + -1.0;
            local_78 = ZEXT416((uint)(fVar11 * local_2cc));
            local_188 = fVar11 * local_2cc * fVar39 + fVar10 * fStack_94;
            fStack_184 = (fVar32 - fVar19) * fVar11 + ((float)local_198._4_4_ - fVar32) * fVar15;
            fStack_180 = fVar16 * 0.0 + 0.0;
            fStack_17c = (float)local_198._4_4_ * fVar20 + (float)local_198._4_4_ * 0.0;
            local_88 = -fVar15;
            fStack_84 = -fStack_94;
            local_268 = fVar11 * fStack_94;
            fStack_264 = (fVar19 - (float)local_198._4_4_) * fStack_94;
            fStack_260 = fStack_94 * 0.0;
            fStack_25c = fStack_94 * 0.0;
            uStack_80 = 0x80000000;
            uStack_7c = 0x80000000;
            fVar28 = (local_2cc * fVar37 + fVar10) * local_268 + local_88 * local_188;
            local_98 = fStack_94 * fVar33;
            fVar10 = fVar15 * fStack_94 * fVar11;
            local_b8._0_4_ = fVar10 * local_2cc;
            local_b8._4_4_ = fStack_94;
            local_b8._8_8_ = 0;
            fVar28 = fVar28 * fVar28;
            fVar20 = (fVar17 - fVar14) * fVar11 + (fVar18 - fVar17) * fVar15;
            fVar21 = (fVar14 - fVar18) * fStack_94;
            local_168 = ZEXT416((uint)fVar20);
            local_158 = ZEXT416((uint)fVar21);
            fVar16 = fVar42 + -1.0;
            fVar22 = (fVar33 * fVar16 + local_2d0) * local_268 -
                     (local_98 * fVar42 + local_2d0 * fVar11) * fVar15;
            local_198._0_4_ =
                 (fVar32 - (float)local_198._4_4_) * fVar15 +
                 ((float)local_198._4_4_ - fVar19) * fStack_94;
            fVar32 = (fVar19 - fVar32) * fVar11;
            local_198._8_8_ = 0;
            local_a8 = ZEXT416((uint)fVar32);
            fVar19 = (fVar17 - fVar18) * fVar15 + (fVar18 - fVar14) * fStack_94;
            local_1a8 = ZEXT416((uint)fVar11);
            fVar11 = (fVar14 - fVar17) * fVar11;
            local_148 = ZEXT416((uint)fVar19);
            local_178 = ZEXT416((uint)fVar11);
            local_1c8._16_4_ = fVar10 * fVar33;
            local_1c8._20_8_ = uVar2 >> 0x20;
            local_1c8._28_4_ = 0;
            fVar22 = fVar22 * fVar22;
            fStack_90 = fStack_94;
            fStack_8c = fStack_94;
            local_68 = fStack_94;
            fStack_64 = fStack_94;
            fStack_60 = fStack_94;
            fStack_5c = fStack_94;
            tcu::computeLodBoundsFromDerivates
                      ((tcu *)&local_288,
                       (((float)local_b8._0_4_ * (fVar37 * fStack_264 + fVar39 * fStack_184)) /
                       fVar28) * local_278,
                       (((fVar37 * fVar21 + fVar39 * fVar20) * (float)local_b8._0_4_) / fVar28) *
                       (float)local_e8._0_4_,
                       (((fVar32 * fVar16 + fVar42 * (float)local_198._0_4_) *
                        (float)local_1c8._16_4_) / fVar22) * local_278,
                       (((fVar16 * fVar11 + fVar42 * fVar19) * (float)local_1c8._16_4_) / fVar22) *
                       (float)local_e8._0_4_,lodPrec);
            local_c8 = fStack_264;
            fStack_c4 = fStack_264;
            fStack_c0 = fStack_264;
            fStack_bc = fStack_264;
            local_188 = fStack_184;
            fStack_180 = fStack_184;
            fStack_17c = fStack_184;
            lVar6 = 0;
            do {
              fVar10 = local_58[lVar6 * 2] + local_2a4;
              fVar14 = local_58[lVar6 * 2 + 1] + local_2a8;
              fVar18 = fVar10 / local_2cc;
              fVar11 = fVar14 / fVar33;
              fVar19 = fVar11 + -1.0;
              fVar10 = (local_2cc * fVar19 + fVar10) * local_268 +
                       ((float)local_78._0_4_ * fVar11 + fVar10 * local_68) * local_88;
              fVar10 = fVar10 * fVar10;
              fVar17 = fVar18 + -1.0;
              fVar14 = (fVar33 * fVar17 + fVar14) * local_268 +
                       (local_98 * fVar18 + fVar14 * (float)local_1a8._0_4_) * local_88;
              fVar14 = fVar14 * fVar14;
              tcu::computeLodBoundsFromDerivates
                        ((tcu *)&local_298,
                         (((local_c8 * fVar19 + local_188 * fVar11) * (float)local_b8._0_4_) /
                         fVar10) * local_278,
                         (((fVar19 * (float)local_158._0_4_ + fVar11 * (float)local_168._0_4_) *
                          (float)local_b8._0_4_) / fVar10) * (float)local_e8._0_4_,
                         ((((float)local_a8._0_4_ * fVar17 + (float)local_198._0_4_ * fVar18) *
                          (float)local_1c8._16_4_) / fVar14) * local_278,
                         (((fVar17 * (float)local_178._0_4_ + fVar18 * (float)local_148._0_4_) *
                          (float)local_1c8._16_4_) / fVar14) * (float)local_e8._0_4_,lodPrec);
              pRVar4 = local_2a0;
              fVar19 = (float)((ulong)local_298 >> 0x20);
              fVar10 = (float)(local_288 >> 0x20);
              uVar38 = -(uint)((float)local_288 <= (float)local_298);
              uVar41 = -(uint)(fVar19 <= fVar10);
              local_288 = CONCAT44(~uVar41 & (uint)fVar19,~uVar38 & (uint)(float)local_298) |
                          CONCAT44((uint)fVar10 & uVar41,(uint)(float)local_288 & uVar38);
              lVar6 = lVar6 + 1;
            } while (lVar6 != 4);
            local_298 = CONCAT44((float)(local_288 >> 0x20) + (float)local_1d8._4_4_,
                                 (float)local_288 + (float)local_1d8._0_4_);
            local_2d8.m_data[0] = local_2a0->minLod;
            local_2d8.m_data[1] = local_2a0->maxLod;
            tcu::clampLodBounds(local_1e8,(Vec2 *)&local_298,&local_2d8,lodPrec);
            bVar5 = tcu::isTexCompareResultValid
                              (local_128,local_130,comparePrec,&local_2b8,(Vec2 *)local_1e8,
                               (pRVar4->super_RenderParams).ref,(float)local_218._0_4_);
            if (!bVar5) {
              local_2d8.m_data[0] = -1.7014636e+38;
              tcu::RGBA::toVec((RGBA *)&local_2d8);
              tcu::PixelBufferAccess::setPixel(local_220,(Vec4 *)&local_298,iVar9,local_2dc,0);
              local_2c8 = (ulong)((int)local_2c8 + 1);
            }
          }
          iVar9 = iVar9 + 1;
          iVar7 = (local_2c0->m_size).m_data[0];
          pCVar8 = local_2c0;
        } while (iVar9 < iVar7);
        iVar9 = (local_2c0->m_size).m_data[1];
      }
      local_2dc = local_2dc + 1;
    } while (local_2dc < iVar9);
  }
  return (int)local_2c8;
}

Assistant:

int computeTextureCompareDiff (const tcu::ConstPixelBufferAccess&	result,
							   const tcu::ConstPixelBufferAccess&	reference,
							   const tcu::PixelBufferAccess&		errorMask,
							   const tcu::Texture2DArrayView&		src,
							   const float*							texCoord,
							   const ReferenceParams&				sampleParams,
							   const tcu::TexComparePrecision&		comparePrec,
							   const tcu::LodPrecision&				lodPrec,
							   const tcu::Vec3&						nonShadowThreshold)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	const tcu::Vec4		sq				= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4		tq				= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4		rq				= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	const tcu::IVec2	dstSize			= tcu::IVec2(result.getWidth(), result.getHeight());
	const float			dstW			= float(dstSize.x());
	const float			dstH			= float(dstSize.y());
	const tcu::IVec2	srcSize			= tcu::IVec2(src.getWidth(), src.getHeight());

	// Coordinates and lod per triangle.
	const tcu::Vec3		triS[2]			= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3		triT[2]			= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3		triR[2]			= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	const tcu::Vec3		triW[2]			= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2		lodBias			((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	int					numFailed		= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= result.getPixel(px, py);
			const tcu::Vec4	refPix	= reference.getPixel(px, py);

			// Other channels should trivially match to reference.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(refPix.swizzle(1,2,3) - resPix.swizzle(1,2,3)), nonShadowThreshold)))
			{
				errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
				numFailed += 1;
				continue;
			}

			// Reference result is known to be a valid result, we can
			// skip verification if thes results are equal
			if (resPix.x() != refPix.x())
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
				const float		triWx	= triNdx ? dstW - wx : wx;
				const float		triWy	= triNdx ? dstH - wy : wy;
				const float		triNx	= triNdx ? 1.0f - nx : nx;
				const float		triNy	= triNdx ? 1.0f - ny : ny;

				const tcu::Vec3	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triR[triNdx], triW[triNdx], triNx, triNy));
				const tcu::Vec2	coordDx		= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
														triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy)) * srcSize.asFloat();
				const tcu::Vec2	coordDy		= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
														triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx)) * srcSize.asFloat();

				tcu::Vec2		lodBounds	= tcu::computeLodBoundsFromDerivates(coordDx.x(), coordDx.y(), coordDy.x(), coordDy.y(), lodPrec);

				// Compute lod bounds across lodOffsets range.
				for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
				{
					const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
					const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
					const float		nxo		= wxo/dstW;
					const float		nyo		= wyo/dstH;

					const tcu::Vec2	coordDxo	= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
															triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo)) * srcSize.asFloat();
					const tcu::Vec2	coordDyo	= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
															triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo)) * srcSize.asFloat();
					const tcu::Vec2	lodO		= tcu::computeLodBoundsFromDerivates(coordDxo.x(), coordDxo.y(), coordDyo.x(), coordDyo.y(), lodPrec);

					lodBounds.x() = de::min(lodBounds.x(), lodO.x());
					lodBounds.y() = de::max(lodBounds.y(), lodO.y());
				}

				const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);
				const bool		isOk		= tcu::isTexCompareResultValid(src, sampleParams.sampler, comparePrec, coord, clampedLod, sampleParams.ref, resPix.x());

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}